

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

void __thiscall Uniforms::printBuffers(Uniforms *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  UniformFunctionsMap *this_00;
  ulong uVar5;
  key_type local_50;
  
  if ((this->buffers).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->buffers).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uniform sampler2D u_buffer",0x1a);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->buffers).
                                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->buffers).
                                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((this->doubleBuffers).super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->doubleBuffers).super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uniform sampler2D u_doubleBuffer",0x20);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->doubleBuffers).
                                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->doubleBuffers).
                                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((this->pyramids).super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->pyramids).super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uniform sampler2D u_pyramid",0x1b);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)(this->pyramids).
                                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->pyramids).
                                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 7) *
                            0x2e8ba2e8ba2e8ba3));
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_scene","");
  this_00 = &this->functions;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar2 = pmVar4->present;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"uniform sampler2D u_scene;",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_sceneDepth","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar2 = pmVar4->present;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"uniform sampler2D u_sceneDepth;",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_scenePosition","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar2 = pmVar4->present;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"uniform sampler2D u_scenePosition;",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_sceneNormal","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar2 = pmVar4->present;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"uniform sampler2D u_sceneNormal;",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Uniforms::printBuffers() {
    for (size_t i = 0; i < buffers.size(); i++)
        std::cout << "uniform sampler2D u_buffer" << i << ";" << std::endl;

    for (size_t i = 0; i < doubleBuffers.size(); i++)
        std::cout << "uniform sampler2D u_doubleBuffer" << i << ";" << std::endl;

    for (size_t i = 0; i < pyramids.size(); i++)
        std::cout << "uniform sampler2D u_pyramid" << i << ";" << std::endl;  

    if (functions["u_scene"].present)
        std::cout << "uniform sampler2D u_scene;" << std::endl;

    if (functions["u_sceneDepth"].present)
        std::cout << "uniform sampler2D u_sceneDepth;" << std::endl;

    if (functions["u_scenePosition"].present)
        std::cout << "uniform sampler2D u_scenePosition;" << std::endl;

    if (functions["u_sceneNormal"].present)
        std::cout << "uniform sampler2D u_sceneNormal;" << std::endl;
}